

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq_test.c
# Opt level: O3

void test_xreq_close_during_recv(void)

{
  nng_msg *msg;
  nng_err nVar1;
  int iVar2;
  uint32_t v;
  char *pcVar3;
  uint32_t v_00;
  nng_pipe local_4c;
  nng_msg *pnStack_48;
  nng_pipe p1;
  nng_msg *m;
  nng_socket local_38;
  nng_pipe p2;
  nng_socket req;
  nng_socket rep;
  
  nVar1 = nng_rep0_open_raw((nng_socket *)&p2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x122,"%s: expected success, got %s (%d)","nng_rep0_open_raw(&rep)",pcVar3
                         ,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_req0_open_raw(&local_38);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                           ,0x123,"%s: expected success, got %s (%d)","nng_req0_open_raw(&req)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_ms((nng_socket)p2.id,"recv-timeout",1000);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x124,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms(local_38,"send-timeout",100);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0x125,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 100)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_int(local_38,"recv-buffer",5);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                 ,0x126,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_int(req, NNG_OPT_RECVBUF, 5)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_int((nng_socket)p2.id,"send-buffer",0x14);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                   ,0x127,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_int(rep, NNG_OPT_SENDBUF, 20)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nuts_marry_ex(local_38,(nng_socket)p2.id,(char *)0x0,&local_4c,
                                    (nng_pipe *)((long)&m + 4));
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                     ,0x129,"%s: expected success, got %s (%d)",
                                     "nuts_marry_ex(req, rep, ((void*)0), &p1, &p2)",pcVar3,nVar1);
              if (iVar2 != 0) {
                iVar2 = nng_pipe_id(local_4c);
                acutest_check_((uint)(0 < iVar2),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0x12a,"%s","nng_pipe_id(p1) > 0");
                iVar2 = nng_pipe_id(m._4_4_);
                acutest_check_((uint)(0 < iVar2),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,299,"%s","nng_pipe_id(p2) > 0");
                v_00 = 0x80000000;
                do {
                  nVar1 = nng_msg_alloc(&stack0xffffffffffffffb8,4);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x12e,"%s: expected success, got %s (%d)",
                                         "nng_msg_alloc(&m, 4)",pcVar3,nVar1);
                  msg = pnStack_48;
                  if (iVar2 == 0) goto LAB_0010dffc;
                  v = nng_pipe_id(m._4_4_);
                  nVar1 = nng_msg_header_append_u32(msg,v);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x12f,"%s: expected success, got %s (%d)",
                                         "nng_msg_header_append_u32(m, nng_pipe_id(p2))",pcVar3,
                                         nVar1);
                  if (iVar2 == 0) goto LAB_0010dffc;
                  nVar1 = nng_msg_header_append_u32(pnStack_48,v_00);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x130,"%s: expected success, got %s (%d)",
                                         "nng_msg_header_append_u32(m, i | 0x80000000u)",pcVar3,
                                         nVar1);
                  if (iVar2 == 0) goto LAB_0010dffc;
                  nuts_sleep(10);
                  nVar1 = nng_sendmsg((nng_socket)p2.id,pnStack_48,0);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x132,"%s: expected success, got %s (%d)",
                                         "nng_sendmsg(rep, m, 0)",pcVar3,nVar1);
                  if (iVar2 == 0) goto LAB_0010dffc;
                  v_00 = v_00 + 1;
                } while (v_00 != 0x80000014);
                nVar1 = nng_socket_close(local_38);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                       ,0x134,"%s: expected success, got %s (%d)",
                                       "nng_socket_close(req)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_socket_close((nng_socket)p2.id);
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                         ,0x135,"%s: expected success, got %s (%d)",
                                         "nng_socket_close(rep)",pcVar3,nVar1);
                  if (iVar2 != 0) {
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010dffc:
  acutest_abort_();
}

Assistant:

static void
test_xreq_close_during_recv(void)
{
	nng_socket rep;
	nng_socket req;
	nng_msg   *m;
	nng_pipe   p1;
	nng_pipe   p2;

	NUTS_PASS(nng_rep0_open_raw(&rep));
	NUTS_PASS(nng_req0_open_raw(&req));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_int(req, NNG_OPT_RECVBUF, 5));
	NUTS_PASS(nng_socket_set_int(rep, NNG_OPT_SENDBUF, 20));

	NUTS_MARRY_EX(req, rep, NULL, &p1, &p2);
	NUTS_TRUE(nng_pipe_id(p1) > 0);
	NUTS_TRUE(nng_pipe_id(p2) > 0);

	for (unsigned i = 0; i < 20; i++) {
		NUTS_PASS(nng_msg_alloc(&m, 4));
		NUTS_PASS(nng_msg_header_append_u32(m, nng_pipe_id(p2)));
		NUTS_PASS(nng_msg_header_append_u32(m, i | 0x80000000u));
		NUTS_SLEEP(10);
		NUTS_PASS(nng_sendmsg(rep, m, 0));
	}
	NUTS_CLOSE(req);
	NUTS_CLOSE(rep);
}